

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

Func * __thiscall
Inline::BuildInlinee
          (Inline *this,JITTimeFunctionBody *funcBody,FunctionJITTimeInfo *inlineeJITData,
          FunctionJITRuntimeInfo *inlineeRuntimeData,RegSlot returnRegSlot,Instr *callInstr,
          uint recursiveInlineDepth)

{
  ProfileId callSiteIdInParentFunc;
  JITTimeWorkItem *this_00;
  Func *pFVar1;
  JitArenaAllocator *alloc;
  ThreadContextInfo *threadContextInfo;
  ScriptContextInfo *scriptContextInfo;
  ScriptContextProfiler *codeGenProfiler;
  void *codeGenAllocators;
  code *pcVar2;
  bool bVar3;
  ExecutionMode EVar4;
  uint32 postCallByteCodeOffset;
  undefined4 *puVar5;
  ProfiledInstr *pPVar6;
  CodeGenWorkItemIDL *workItemData;
  CodeGenWorkItemIDL *pCVar7;
  JITTimeWorkItem *this_01;
  intptr_t funcBodyAddr;
  JITTimePolymorphicInlineCacheInfo *polymorphicInlineCacheInfo;
  Func *this_02;
  JITOutputIDL *outputData;
  
  if (callInstr->m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x590,"(callInstr->IsProfiledInstr())","callInstr->IsProfiledInstr()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pPVar6 = IR::Instr::AsProfiledInstr(callInstr);
  callSiteIdInParentFunc = (pPVar6->u).field_3.fldInfoData.f1;
  workItemData = (CodeGenWorkItemIDL *)
                 new<Memory::JitArenaAllocator>(0x60,this->topFunc->m_alloc,0x3d6ef4);
  bVar3 = Func::IsJitInDebugMode(this->topFunc);
  workItemData->isJitInDebugMode = bVar3;
  workItemData->type = '\0';
  EVar4 = JITTimeWorkItem::GetJitMode(this->topFunc->m_workItem);
  workItemData->jitMode = EVar4;
  pCVar7 = JITTimeWorkItem::GetWorkItemData(this->topFunc->m_workItem);
  workItemData->nativeDataAddr = pCVar7->nativeDataAddr;
  workItemData->loopNumber = 0xffffffff;
  workItemData->jitData = &inlineeJITData->m_data;
  this_01 = (JITTimeWorkItem *)new<Memory::JitArenaAllocator>(0x1e0,this->topFunc->m_alloc,0x3d6ef4)
  ;
  JITTimeWorkItem::JITTimeWorkItem(this_01,workItemData);
  this_00 = this->topFunc->m_workItem;
  funcBodyAddr = JITTimeFunctionBody::GetAddr(funcBody);
  polymorphicInlineCacheInfo =
       JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(this_00,funcBodyAddr);
  this_02 = (Func *)new<Memory::JitArenaAllocator>(0x420,this->topFunc->m_alloc,0x3d6ef4);
  pFVar1 = this->topFunc;
  alloc = pFVar1->m_alloc;
  threadContextInfo = pFVar1->m_threadContextInfo;
  scriptContextInfo = pFVar1->m_scriptContextInfo;
  outputData = JITOutput::GetOutputData(&pFVar1->m_output);
  pFVar1 = this->topFunc;
  codeGenProfiler = pFVar1->m_codeGenProfiler;
  codeGenAllocators = pFVar1->topFunc->m_codeGenAllocators;
  bVar3 = pFVar1->m_isBackgroundJIT;
  pFVar1 = callInstr->m_func;
  postCallByteCodeOffset = IR::Instr::GetByteCodeOffset(callInstr->m_next);
  Func::Func(this_02,alloc,this_01,threadContextInfo,scriptContextInfo,outputData,
             (EntryPointInfo *)0x0,inlineeRuntimeData,polymorphicInlineCacheInfo,codeGenAllocators,
             codeGenProfiler,bVar3,pFVar1,postCallByteCodeOffset,returnRegSlot,false,
             callSiteIdInParentFunc,false);
  BuildIRForInlinee(this,this_02,funcBody,callInstr,false,recursiveInlineDepth);
  return this_02;
}

Assistant:

Func *
Inline::BuildInlinee(JITTimeFunctionBody* funcBody, const FunctionJITTimeInfo * inlineeJITData, const FunctionJITRuntimeInfo * inlineeRuntimeData, Js::RegSlot returnRegSlot, IR::Instr *callInstr, uint recursiveInlineDepth)
{
    Assert(callInstr->IsProfiledInstr());
    Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId);

    CodeGenWorkItemIDL * workItemData = JitAnewStruct(this->topFunc->m_alloc, CodeGenWorkItemIDL);

    workItemData->isJitInDebugMode = this->topFunc->IsJitInDebugMode();
    workItemData->type = JsFunctionType;
    workItemData->jitMode = static_cast<char>(this->topFunc->GetWorkItem()->GetJitMode());
    workItemData->nativeDataAddr = this->topFunc->GetWorkItem()->GetWorkItemData()->nativeDataAddr;
    workItemData->loopNumber = Js::LoopHeader::NoLoop;

    workItemData->jitData = (FunctionJITTimeDataIDL*)(inlineeJITData);
    JITTimeWorkItem * jitWorkItem = JitAnew(this->topFunc->m_alloc, JITTimeWorkItem, workItemData);

    JITTimePolymorphicInlineCacheInfo * entryPointPolymorphicInlineCacheInfo = this->topFunc->GetWorkItem()->GetInlineePolymorphicInlineCacheInfo(funcBody->GetAddr());
#if !FLOATVAR
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
                            Func,
                            this->topFunc->m_alloc,
                            jitWorkItem,
                            this->topFunc->GetThreadContextInfo(),
                            this->topFunc->GetScriptContextInfo(),
                            this->topFunc->GetJITOutput()->GetOutputData(),
                            nullptr,
                            inlineeRuntimeData,
                            entryPointPolymorphicInlineCacheInfo,
                            this->topFunc->GetCodeGenAllocators(),
                            this->topFunc->GetNumberAllocator(),
                            this->topFunc->GetCodeGenProfiler(),
                            this->topFunc->IsBackgroundJIT(),
                            callInstr->m_func,
                            callInstr->m_next->GetByteCodeOffset(),
                            returnRegSlot,
                            false,
                            callSiteId,
                            false);
#else
        Func * inlinee = JitAnew(this->topFunc->m_alloc,
                            Func,
                            this->topFunc->m_alloc,
                            jitWorkItem,
                            this->topFunc->GetThreadContextInfo(),
                            this->topFunc->GetScriptContextInfo(),
                            this->topFunc->GetJITOutput()->GetOutputData(),
                            nullptr,
                            inlineeRuntimeData,
                            entryPointPolymorphicInlineCacheInfo,
                            this->topFunc->GetCodeGenAllocators(),
                            this->topFunc->GetCodeGenProfiler(),
                            this->topFunc->IsBackgroundJIT(),
                            callInstr->m_func,
                            callInstr->m_next->GetByteCodeOffset(),
                            returnRegSlot,
                            false,
                            callSiteId,
                            false);
#endif

    BuildIRForInlinee(inlinee, funcBody, callInstr, false, recursiveInlineDepth);
    return inlinee;
}